

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

void __thiscall
cmCTestSVN::StatusParser::StatusParser(StatusParser *this,cmCTestSVN *svn,char *prefix)

{
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__StatusParser_0069a5f8;
  this->SVN = svn;
  (this->RegexStatus).regmatch.startp[0] = (char *)0x0;
  (this->RegexStatus).regmatch.endp[0] = (char *)0x0;
  (this->RegexStatus).regmatch.searchstring = (char *)0x0;
  (this->RegexStatus).program = (char *)0x0;
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(svn->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexStatus,"^([ACDIMRX?!~ ])([CM ])[ L]... +(.+)$");
  return;
}

Assistant:

StatusParser(cmCTestSVN* svn, const char* prefix)
    : SVN(svn)
  {
    this->SetLog(&svn->Log, prefix);
    this->RegexStatus.compile("^([ACDIMRX?!~ ])([CM ])[ L]... +(.+)$");
  }